

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O1

float float32_unpack(uint32 x)

{
  double dVar1;
  
  dVar1 = (double)(x & 0x1fffff);
  if ((int)x < 0) {
    dVar1 = (double)((ulong)dVar1 | (ulong)DAT_001269e0);
  }
  dVar1 = (double)SDL_scalbn((double)(float)dVar1,(x >> 0x15 & 0x3ff) - 0x314);
  return (float)dVar1;
}

Assistant:

static float float32_unpack(uint32 x)
{
   // from the specification
   uint32 mantissa = x & 0x1fffff;
   uint32 sign = x & 0x80000000;
   uint32 exp = (x & 0x7fe00000) >> 21;
   double res = sign ? -(double)mantissa : (double)mantissa;
   return (float) ldexp((float)res, exp-788);
}